

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# el.c
# Opt level: O3

wchar_t el_editmode(EditLine *el,wchar_t argc,wchar_t **argv)

{
  wchar_t *__s1;
  int iVar1;
  wchar_t wVar2;
  
  wVar2 = L'\xffffffff';
  if ((argc == L'\x02' && argv != (wchar_t **)0x0) && (__s1 = argv[1], __s1 != (wchar_t *)0x0)) {
    iVar1 = wcscmp(__s1,anon_var_dwarf_a978 + 0xc);
    if (iVar1 == 0) {
      *(byte *)&el->el_flags = (byte)el->el_flags & 0xfb;
      tty_rawmode(el);
    }
    else {
      iVar1 = wcscmp(__s1,anon_var_dwarf_ebb);
      if (iVar1 != 0) {
        fprintf((FILE *)el->el_errfile,"edit: Bad value `%ls\'.\n",__s1);
        return L'\xffffffff';
      }
      tty_cookedmode(el);
      *(byte *)&el->el_flags = (byte)el->el_flags | 4;
    }
    wVar2 = L'\0';
  }
  return wVar2;
}

Assistant:

libedit_private int
/*ARGSUSED*/
el_editmode(EditLine *el, int argc, const wchar_t **argv)
{
	const wchar_t *how;

	if (argv == NULL || argc != 2 || argv[1] == NULL)
		return -1;

	how = argv[1];
	if (wcscmp(how, L"on") == 0) {
		el->el_flags &= ~EDIT_DISABLED;
		tty_rawmode(el);
	} else if (wcscmp(how, L"off") == 0) {
		tty_cookedmode(el);
		el->el_flags |= EDIT_DISABLED;
	}
	else {
		(void) fprintf(el->el_errfile, "edit: Bad value `%ls'.\n",
		    how);
		return -1;
	}
	return 0;
}